

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_insert(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  ion_bpp_node_t *piVar1;
  char cVar2;
  ion_bpp_err_t iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ion_bpp_address_t adr;
  ion_bpp_buffer_t *buf;
  uint uVar7;
  ion_bpp_key_t *piVar8;
  ion_bpp_key_t *mkey;
  void *local_88;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_external_address_t local_78;
  uint local_6c;
  uint local_68;
  int local_64;
  ion_bpp_address_t local_60;
  ion_bpp_buffer_t *tmp [4];
  
  local_88 = key;
  local_78 = rec;
  if (*(int *)((long)handle + 0xb8) * 3 == (uint)(**(ushort **)((long)handle + 0x38) >> 1)) {
    gatherRoot(handle);
    iVar3 = scatter(handle,(ion_bpp_buffer_t *)((long)handle + 0x20),
                    (ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,tmp);
    if (iVar3 != bErrOk) {
      return iVar3;
    }
  }
  uVar5 = 0;
  uVar7 = 0;
  iVar4 = 0;
  buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  do {
    if ((undefined1  [40])((undefined1  [40])*buf->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      if (maxHeight < iVar4) {
        maxHeight = iVar4;
      }
      iVar4 = search(handle,buf,local_88,local_78,&mkey,MODE_MATCH);
      if (iVar4 == 1) {
        if ((*(int *)((long)handle + 0xc) == 0) &&
           (cVar2 = (**(code **)((long)handle + 0x18))
                              (local_88,mkey,*(undefined4 *)((long)handle + 8)), cVar2 == '\0')) {
          return bErrDupKeys;
        }
        mkey = mkey + *(int *)((long)handle + 0xbc);
      }
      else {
        if (iVar4 == 0) {
          return bErrDupKeys;
        }
        if ((((iVar4 == -1) && (*(int *)((long)handle + 0xc) == 0)) && (1 < *(ushort *)buf->p)) &&
           (cVar2 = (**(code **)((long)handle + 0x18))
                              (local_88,mkey,*(undefined4 *)((long)handle + 8)), cVar2 == '\0')) {
          return bErrDupKeys;
        }
      }
      piVar8 = mkey;
      iVar6 = ((int)mkey - (int)buf->p) + -0x20;
      iVar4 = (uint)(*(ushort *)buf->p >> 1) * *(int *)((long)handle + 0xbc) - iVar6;
      if (iVar4 != 0) {
        memmove(mkey + *(int *)((long)handle + 0xbc),mkey,(long)iVar4);
      }
      memcpy(piVar8,local_88,(long)*(int *)((long)handle + 8));
      iVar4 = *(int *)((long)handle + 8);
      *(ion_bpp_external_address_t *)(piVar8 + iVar4) = local_78;
      piVar8 = piVar8 + (long)iVar4 + 8;
      piVar8[0] = '\0';
      piVar8[1] = '\0';
      piVar8[2] = '\0';
      piVar8[3] = '\0';
      piVar8[4] = '\0';
      piVar8[5] = '\0';
      piVar8[6] = '\0';
      piVar8[7] = '\0';
      *(short *)buf->p = *(short *)buf->p + 2;
      buf->valid = boolean_true;
      buf->modified = boolean_true;
      if ((iVar6 == 0) && (uVar7 != 0)) {
        iVar3 = readDisk(handle,local_60,&cbuf);
        if (iVar3 != bErrOk) {
          return iVar3;
        }
        piVar1 = cbuf->p;
        memcpy(&piVar1->fkey,local_88,(long)*(int *)((long)handle + 8));
        *(ion_bpp_external_address_t *)(&piVar1->fkey + *(int *)((long)handle + 8)) = local_78;
        cbuf->valid = boolean_true;
        cbuf->modified = boolean_true;
      }
      nKeysIns = nKeysIns + 1;
      return bErrOk;
    }
    local_6c = uVar5;
    local_68 = uVar7;
    local_64 = iVar4;
    iVar4 = search(handle,buf,local_88,local_78,&mkey,MODE_MATCH);
    piVar8 = mkey;
    if (iVar4 < 0) {
      adr = *(ion_bpp_address_t *)(mkey + -8);
    }
    else {
      adr = *(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar3 = readDisk(handle,adr,&cbuf);
    if (iVar3 != bErrOk) {
      return iVar3;
    }
    if (*(uint *)((long)handle + 0xb8) == (uint)(*(ushort *)cbuf->p >> 1)) {
      iVar3 = gather(handle,buf,&mkey,tmp);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
      iVar3 = scatter(handle,buf,mkey,3,tmp);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
      iVar4 = search(handle,buf,local_88,local_78,&mkey,MODE_MATCH);
      piVar8 = mkey;
      if (-1 < iVar4) {
        iVar3 = readDisk(handle,*(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8),
                         &cbuf);
        if (iVar3 != bErrOk) {
          return iVar3;
        }
        goto LAB_0010e3ec;
      }
      iVar3 = readDisk(handle,*(ion_bpp_address_t *)(mkey + -8),&cbuf);
      if (iVar3 != bErrOk) {
        return iVar3;
      }
LAB_0010e3de:
      if (piVar8 != &buf->p->fkey) goto LAB_0010e3ec;
      uVar7 = local_68;
      if (local_6c != 0) {
        uVar7 = 1;
      }
      uVar5 = (uint)(local_6c != 0);
    }
    else {
      if (iVar4 < 0) goto LAB_0010e3de;
LAB_0010e3ec:
      local_60 = buf->adr;
      uVar7 = 0;
      uVar5 = 1;
    }
    iVar4 = local_64 + 1;
    buf = cbuf;
  } while( true );
}

Assistant:

ion_bpp_err_t
b_insert(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;			/* match key */
	int					len;	/* length to shift */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	unsigned int		keyOff;
	ion_bpp_bool_t		lastGEvalid;		/* true if GE branch taken */
	ion_bpp_bool_t		lastLTvalid;		/* true if LT branch taken after GE branch */
	ion_bpp_address_t	lastGE;			/* last childGE traversed */
	unsigned int		lastGEkey;	/* last childGE key traversed */
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root		= &h->root;
	lastGEvalid = boolean_false;
	lastLTvalid = boolean_false;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to insertion point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */

					if (!h->dupKeys && (0 != ct(buf)) && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					break;

				case ION_CC_EQ:	/* key = mkey */
					return bErrDupKeys;
					break;

				case ION_CC_GT:	/* key > mkey */

					if (!h->dupKeys && (h->comp(key, mkey, (ion_key_size_t) (h->keySize)) == ION_CC_EQ)) {
						return bErrDupKeys;
					}

					mkey += ks(1);
					break;
			}

			/* shift items GE key to right */
			keyOff	= mkey - fkey(buf);
			len		= ks(ct(buf)) - keyOff;

			if (len) {
				memmove(mkey + ks(1), mkey, len);
			}

			/* insert new key */
			memcpy(key(mkey), key, h->keySize);
			rec(mkey)		= rec;
			childGE(mkey)	= 0;
			ct(buf)++;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}

			/* if new key is first key, then fixup lastGE key */
			if (!keyOff && lastLTvalid) {
				ion_bpp_buffer_t	*tbuf;
				ion_bpp_key_t		*tkey;

				if ((rc = readDisk(handle, lastGE, &tbuf)) != 0) {
					return rc;
				}

				/* tkey = fkey(tbuf) + lastGEkey; */
				tkey		= fkey(tbuf);
				memcpy(key(tkey), key, h->keySize);
				rec(tkey)	= rec;

				if ((rc = writeDisk(tbuf)) != 0) {
					return rc;
				}
			}

			nKeysIns++;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			if ((cc >= 0) || (mkey != fkey(buf))) {
				lastGEvalid = boolean_true;
				lastLTvalid = boolean_false;
				lastGE		= buf->adr;
				lastGEkey	= mkey - fkey(buf);

				if (cc < 0) {
					lastGEkey -= ks(1);
				}
			}
			else {
				if (lastGEvalid) {
					lastLTvalid = boolean_true;
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}